

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.c
# Opt level: O2

ZyanStatus
ZydisFormatterTokenizeOperand
          (ZydisFormatter *formatter,ZydisDecodedInstruction *instruction,
          ZydisDecodedOperand *operand,void *buffer,ZyanUSize length,ZyanU64 runtime_address,
          ZydisFormatterTokenConst **token,void *user_data)

{
  undefined4 in_EAX;
  int iVar1;
  ZyanStatus ZVar2;
  ZydisFormatterTokenConst *pZVar3;
  undefined1 auVar4 [16];
  ZydisFormatterToken *first_token;
  ZydisFormatterBuffer formatter_buffer;
  ZydisFormatterContext local_b0;
  ZydisFormatterTokenConst *local_88;
  ZydisFormatterBuffer local_80;
  
  auVar4._0_4_ = -(uint)(formatter == (ZydisFormatter *)0x0);
  auVar4._4_4_ = -(uint)(instruction == (ZydisDecodedInstruction *)0x0);
  auVar4._8_4_ = -(uint)(operand == (ZydisDecodedOperand *)0x0);
  auVar4._12_4_ = -(uint)(buffer == (void *)0x0);
  iVar1 = movmskps(in_EAX,auVar4);
  ZVar2 = 0x80100004;
  if ((token != (ZydisFormatterTokenConst **)0x0 && 2 < length) && iVar1 == 0) {
    ZydisFormatterBufferInitTokenized(&local_80,&local_88,buffer,length);
    local_b0.operands = (ZydisDecodedOperand *)0x0;
    local_b0.user_data = user_data;
    local_b0.instruction = instruction;
    local_b0.operand = operand;
    local_b0.runtime_address = runtime_address;
    if ((formatter->func_pre_operand == (ZydisFormatterFunc)0x0) ||
       (ZVar2 = (*formatter->func_pre_operand)(formatter,&local_80,&local_b0), -1 < (int)ZVar2)) {
      switch((local_b0.operand)->type) {
      case ZYDIS_OPERAND_TYPE_REGISTER:
        ZVar2 = (*formatter->func_format_operand_reg)(formatter,&local_80,&local_b0);
        break;
      case ZYDIS_OPERAND_TYPE_MEMORY:
        ZVar2 = (*formatter->func_format_operand_mem)(formatter,&local_80,&local_b0);
        break;
      case ZYDIS_OPERAND_TYPE_POINTER:
        ZVar2 = (*formatter->func_format_operand_ptr)(formatter,&local_80,&local_b0);
        break;
      case ZYDIS_OPERAND_TYPE_IMMEDIATE:
        ZVar2 = (*formatter->func_format_operand_imm)(formatter,&local_80,&local_b0);
        break;
      default:
        return 0x80100004;
      }
      if ((-1 < (int)ZVar2) &&
         ((formatter->func_post_operand == (ZydisFormatterFunc)0x0 ||
          (ZVar2 = (*formatter->func_post_operand)(formatter,&local_80,&local_b0), -1 < (int)ZVar2))
         )) {
        pZVar3 = (ZydisFormatterTokenConst *)(&local_88[1].type + local_88->next);
        if ((ulong)local_88->next == 0) {
          pZVar3 = local_88;
        }
        *token = pZVar3;
        ZVar2 = 0x100000;
      }
    }
  }
  return ZVar2;
}

Assistant:

ZyanStatus ZydisFormatterTokenizeOperand(const ZydisFormatter* formatter,
    const ZydisDecodedInstruction* instruction, const ZydisDecodedOperand* operand,
    void* buffer, ZyanUSize length, ZyanU64 runtime_address, ZydisFormatterTokenConst** token,
    void* user_data)
{
    if (!formatter || !instruction || !operand || !buffer ||
        (length <= sizeof(ZydisFormatterToken)) || !token)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    ZydisFormatterToken* first_token;
    ZydisFormatterBuffer formatter_buffer;
    ZydisFormatterBufferInitTokenized(&formatter_buffer, &first_token, buffer, length);

    ZydisFormatterContext context;
    context.instruction     = instruction;
    context.operands        = ZYAN_NULL;
    context.runtime_address = runtime_address;
    context.operand         = operand;
    context.user_data       = user_data;

    // We ignore `ZYDIS_STATUS_SKIP_TOKEN` for all operand-functions as it does not make any sense
    // to skip the only operand printed by this function

    if (formatter->func_pre_operand)
    {
        ZYAN_CHECK(formatter->func_pre_operand(formatter, &formatter_buffer, &context));
    }

    switch (context.operand->type)
    {
    case ZYDIS_OPERAND_TYPE_REGISTER:
        ZYAN_CHECK(formatter->func_format_operand_reg(formatter, &formatter_buffer, &context));
        break;
    case ZYDIS_OPERAND_TYPE_MEMORY:
        ZYAN_CHECK(formatter->func_format_operand_mem(formatter, &formatter_buffer, &context));
        break;
    case ZYDIS_OPERAND_TYPE_IMMEDIATE:
        ZYAN_CHECK(formatter->func_format_operand_imm(formatter, &formatter_buffer, &context));
        break;
    case ZYDIS_OPERAND_TYPE_POINTER:
        ZYAN_CHECK(formatter->func_format_operand_ptr(formatter, &formatter_buffer, &context));
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (formatter->func_post_operand)
    {
        ZYAN_CHECK(formatter->func_post_operand(formatter, &formatter_buffer, &context));
    }

    if (first_token->next)
    {
        *token = (ZydisFormatterTokenConst*)((ZyanU8*)first_token + sizeof(ZydisFormatterToken) +
            first_token->next);
        return ZYAN_STATUS_SUCCESS;
    }

    *token = first_token;
    return ZYAN_STATUS_SUCCESS;
}